

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trick.cpp
# Opt level: O2

void __thiscall Trick::Trick(Trick *this,Trick *obj)

{
  pointer ptVar1;
  int iVar2;
  tuple<int,_Card> *move;
  pointer __x;
  
  (this->m_trick_pile).
  super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_trick_pile).
  super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_trick_pile).
  super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_suit_asked = 3;
  iVar2 = obj->m_trump_suit;
  this->m_suit_asked = obj->m_suit_asked;
  this->m_trump_suit = iVar2;
  ptVar1 = (obj->m_trick_pile).
           super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (__x = (obj->m_trick_pile).
             super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>.
             _M_impl.super__Vector_impl_data._M_start; __x != ptVar1; __x = __x + 1) {
    std::vector<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>::push_back
              (&this->m_trick_pile,__x);
  }
  return;
}

Assistant:

Trick::Trick(const Trick &obj)
{
    m_suit_asked = obj.m_suit_asked;
    m_trump_suit = obj.m_trump_suit;
    for(auto const &move : obj.m_trick_pile) {
        m_trick_pile.push_back(move);
    }
}